

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3_arena.pb.cc
# Opt level: O3

size_t __thiscall proto3_arena_unittest::NestedTestAllTypes::ByteSizeLong(NestedTestAllTypes *this)

{
  int iVar1;
  int iVar2;
  anon_union_56_1_493b367e_for_NestedTestAllTypes_3 aVar3;
  uint uVar4;
  Rep *pRVar5;
  size_t sVar6;
  RepeatedPtrField<proto3_arena_unittest::NestedTestAllTypes> *this_00;
  size_t sVar7;
  RepeatedPtrField<proto3_arena_unittest::NestedTestAllTypes> *pRVar8;
  
  sVar7 = (size_t)*(int *)((long)&this->field_0 + 0x10);
  this_00 = &(this->field_0)._impl_.repeated_child_;
  pRVar8 = this_00;
  if ((undefined1  [56])((undefined1  [56])this->field_0 & (undefined1  [56])0x1) !=
      (undefined1  [56])0x0) {
    pRVar5 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                       (&this_00->super_RepeatedPtrFieldBase);
    pRVar8 = (RepeatedPtrField<proto3_arena_unittest::NestedTestAllTypes> *)pRVar5->elements;
    if (((ulong)(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
      pRVar5 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                         (&this_00->super_RepeatedPtrFieldBase);
      this_00 = (RepeatedPtrField<proto3_arena_unittest::NestedTestAllTypes> *)pRVar5->elements;
    }
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x10);
  for (; pRVar8 != (RepeatedPtrField<proto3_arena_unittest::NestedTestAllTypes> *)
                   (&(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar1);
      pRVar8 = (RepeatedPtrField<proto3_arena_unittest::NestedTestAllTypes> *)
               &(pRVar8->super_RepeatedPtrFieldBase).current_size_) {
    sVar6 = ByteSizeLong((NestedTestAllTypes *)
                         (pRVar8->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    uVar4 = (uint)sVar6 | 1;
    iVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar7 = sVar7 + sVar6 + (ulong)(iVar2 * 9 + 0x49U >> 6);
  }
  aVar3 = this->field_0;
  if (((undefined1  [56])aVar3 & (undefined1  [56])0x7) != (undefined1  [56])0x0) {
    if (((undefined1  [56])aVar3 & (undefined1  [56])0x1) != (undefined1  [56])0x0) {
      sVar6 = ByteSizeLong((this->field_0)._impl_.child_);
      uVar4 = (uint)sVar6 | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar7 = sVar7 + sVar6 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [56])aVar3 & (undefined1  [56])0x2) != (undefined1  [56])0x0) {
      sVar6 = TestAllTypes::ByteSizeLong((this->field_0)._impl_.payload_);
      uVar4 = (uint)sVar6 | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar7 = sVar7 + sVar6 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if (((undefined1  [56])aVar3 & (undefined1  [56])0x4) != (undefined1  [56])0x0) {
      sVar6 = TestAllTypes::ByteSizeLong((this->field_0)._impl_.lazy_payload_);
      uVar4 = (uint)sVar6 | 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar7 = sVar7 + sVar6 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
    }
  }
  sVar7 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar7,&(this->field_0)._impl_._cached_size_);
  return sVar7;
}

Assistant:

::size_t NestedTestAllTypes::ByteSizeLong() const {
  const NestedTestAllTypes& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto3_arena_unittest.NestedTestAllTypes)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .proto3_arena_unittest.NestedTestAllTypes repeated_child = 3;
    {
      total_size += 1UL * this_._internal_repeated_child_size();
      for (const auto& msg : this_._internal_repeated_child()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    // .proto3_arena_unittest.NestedTestAllTypes child = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.child_);
    }
    // .proto3_arena_unittest.TestAllTypes payload = 2;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.payload_);
    }
    // .proto3_arena_unittest.TestAllTypes lazy_payload = 4 [lazy = true];
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.lazy_payload_);
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}